

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

int keep_one_comp_stat(MV_STATS *mv_stats,int comp_val,int comp_idx,AV1_COMP *cpi,int *rates)

{
  byte bVar1;
  byte val;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  aom_cdf_prob *cdf;
  aom_cdf_prob *cdf_00;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  bool val_00;
  int total_rate;
  int high_part_rate;
  int frac_part_rate;
  int i;
  int n;
  int int_bit_rate;
  int class_rate;
  int sign_rate;
  aom_cdf_prob *high_part_cdf;
  aom_cdf_prob *frac_part_cdf;
  aom_cdf_prob (*bits_cdf) [3];
  aom_cdf_prob *class0_cdf;
  aom_cdf_prob *class_cdf;
  aom_cdf_prob *sign_cdf;
  nmv_component *cur_mvcomp_ctx;
  nmv_component *mvcomp_ctx;
  nmv_context *nmvc;
  FRAME_CONTEXT *ec_ctx;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int r_idx;
  int use_hp;
  int high_part;
  int frac_part;
  int int_part;
  int mv_class;
  int offset;
  int mag_minus_1;
  int mag;
  int sign;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  aom_cdf_prob *cdf_01;
  aom_cdf_prob *paVar8;
  undefined4 in_stack_ffffffffffffff30;
  int local_bc;
  int local_b4;
  uint local_30;
  
  val_00 = in_ESI < 0;
  if (val_00) {
    in_ESI = -in_ESI;
  }
  val = av1_get_mv_class((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                         (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  uVar2 = (uint)val;
  iVar3 = (int)local_30 >> 3;
  uVar4 = local_30 & 1;
  bVar1 = *(byte *)(in_RCX + 0x3c16d);
  cdf = (aom_cdf_prob *)(*(long *)(in_RCX + 0x17b68) + 0x2e92 + (long)in_EDX * 0x8a);
  if (uVar2 == 0) {
    cdf_00 = cdf + (long)iVar3 * 5 + 0xc;
    cdf_01 = cdf + 0x1e;
  }
  else {
    cdf_00 = cdf + 0x16;
    cdf_01 = cdf + 0x21;
  }
  paVar8 = cdf_00;
  iVar5 = get_symbol_cost((aom_cdf_prob *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
                          (int)((ulong)cdf_00 >> 0x20));
  *in_R8 = iVar5;
  update_cdf(cdf + 0x1b,val_00,2);
  iVar6 = get_symbol_cost((aom_cdf_prob *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
                          (int)((ulong)paVar8 >> 0x20));
  in_R8[1] = iVar6;
  update_cdf(cdf,val,0xb);
  iVar7 = (int)((ulong)paVar8 >> 0x20);
  local_b4 = 0;
  if (uVar2 == 0) {
    local_b4 = get_symbol_cost((aom_cdf_prob *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),iVar7);
    update_cdf(cdf + 0x24,(int8_t)iVar3,2);
  }
  else {
    for (local_bc = 0; iVar7 = (int)((ulong)paVar8 >> 0x20), local_bc < (int)uVar2;
        local_bc = local_bc + 1) {
      iVar7 = get_symbol_cost((aom_cdf_prob *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),iVar7);
      local_b4 = iVar7 + local_b4;
      update_cdf(cdf + (long)local_bc * 3 + 0x27,(byte)(iVar3 >> ((byte)local_bc & 0x1f)) & 1,2);
    }
  }
  in_R8[2] = local_b4;
  iVar3 = get_symbol_cost((aom_cdf_prob *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),iVar7);
  in_R8[3] = iVar3;
  update_cdf(cdf_00,(byte)((int)local_30 >> 1) & 3,4);
  if ((bVar1 & 1) == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = get_symbol_cost((aom_cdf_prob *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),iVar7);
    update_cdf(cdf_01,(int8_t)uVar4,2);
  }
  in_R8[4] = iVar7;
  *(uint *)(in_RDI + 0x28) = (uint)((uVar4 != 0 ^ 0xffU) & 1) + *(int *)(in_RDI + 0x28);
  *(uint *)(in_RDI + 0x2c) = uVar4 + *(int *)(in_RDI + 0x2c);
  return iVar5 + iVar6 + local_b4 + iVar3 + iVar7;
}

Assistant:

static inline int keep_one_comp_stat(MV_STATS *mv_stats, int comp_val,
                                     int comp_idx, const AV1_COMP *cpi,
                                     int *rates) {
  assert(comp_val != 0 && "mv component should not have zero value!");
  const int sign = comp_val < 0;
  const int mag = sign ? -comp_val : comp_val;
  const int mag_minus_1 = mag - 1;
  int offset;
  const int mv_class = av1_get_mv_class(mag_minus_1, &offset);
  const int int_part = offset >> 3;         // int mv data
  const int frac_part = (offset >> 1) & 3;  // fractional mv data
  const int high_part = offset & 1;         // high precision mv data
  const int use_hp = cpi->common.features.allow_high_precision_mv;
  int r_idx = 0;

  const MACROBLOCK *const x = &cpi->td.mb;
  const MACROBLOCKD *const xd = &x->e_mbd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  nmv_context *nmvc = &ec_ctx->nmvc;
  nmv_component *mvcomp_ctx = nmvc->comps;
  nmv_component *cur_mvcomp_ctx = &mvcomp_ctx[comp_idx];
  aom_cdf_prob *sign_cdf = cur_mvcomp_ctx->sign_cdf;
  aom_cdf_prob *class_cdf = cur_mvcomp_ctx->classes_cdf;
  aom_cdf_prob *class0_cdf = cur_mvcomp_ctx->class0_cdf;
  aom_cdf_prob(*bits_cdf)[3] = cur_mvcomp_ctx->bits_cdf;
  aom_cdf_prob *frac_part_cdf = mv_class
                                    ? (cur_mvcomp_ctx->fp_cdf)
                                    : (cur_mvcomp_ctx->class0_fp_cdf[int_part]);
  aom_cdf_prob *high_part_cdf =
      mv_class ? (cur_mvcomp_ctx->hp_cdf) : (cur_mvcomp_ctx->class0_hp_cdf);

  const int sign_rate = get_symbol_cost(sign_cdf, sign);
  rates[r_idx++] = sign_rate;
  update_cdf(sign_cdf, sign, 2);

  const int class_rate = get_symbol_cost(class_cdf, mv_class);
  rates[r_idx++] = class_rate;
  update_cdf(class_cdf, mv_class, MV_CLASSES);

  int int_bit_rate = 0;
  if (mv_class == MV_CLASS_0) {
    int_bit_rate = get_symbol_cost(class0_cdf, int_part);
    update_cdf(class0_cdf, int_part, CLASS0_SIZE);
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (int i = 0; i < n; ++i) {
      int_bit_rate += get_symbol_cost(bits_cdf[i], (int_part >> i) & 1);
      update_cdf(bits_cdf[i], (int_part >> i) & 1, 2);
    }
  }
  rates[r_idx++] = int_bit_rate;
  const int frac_part_rate = get_symbol_cost(frac_part_cdf, frac_part);
  rates[r_idx++] = frac_part_rate;
  update_cdf(frac_part_cdf, frac_part, MV_FP_SIZE);
  const int high_part_rate =
      use_hp ? get_symbol_cost(high_part_cdf, high_part) : 0;
  if (use_hp) {
    update_cdf(high_part_cdf, high_part, 2);
  }
  rates[r_idx++] = high_part_rate;

  mv_stats->last_bit_zero += !high_part;
  mv_stats->last_bit_nonzero += high_part;
  const int total_rate =
      (sign_rate + class_rate + int_bit_rate + frac_part_rate + high_part_rate);
  return total_rate;
}